

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O3

Aig_Man_t * Aig_ManConvertBddsToAigs(Aig_Man_t *p,DdManager *dd,Vec_Ptr_t *vCofs)

{
  char *__s;
  void *pvVar1;
  int iVar2;
  Aig_Man_t *p_00;
  size_t sVar3;
  char *__dest;
  Aig_Obj_t *pAVar4;
  st__table *table;
  DdNode *pDVar5;
  DdNode *pDVar6;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  
  Aig_ManCleanData(p);
  p_00 = Aig_ManStart(p->vObjs->nSize - p->nDeleted);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar3 = strlen(__s);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar9 = 0;
    do {
      pvVar1 = pVVar8->pArray[lVar9];
      pAVar4 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      lVar9 = lVar9 + 1;
      pVVar8 = p->vCis;
    } while (lVar9 < pVVar8->nSize);
  }
  table = st__init_table(st__ptrcmp,st__ptrhash);
  pDVar5 = Cudd_ReadOne(dd);
  st__insert(table,(char *)pDVar5,(char *)p_00->pConst1);
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar9 = 0;
    do {
      pvVar1 = pVVar8->pArray[lVar9];
      pDVar5 = Cudd_bddIthVar(dd,(int)lVar9);
      st__insert(table,(char *)pDVar5,*(char **)((long)pvVar1 + 0x28));
      lVar9 = lVar9 + 1;
      pVVar8 = p->vCis;
    } while (lVar9 < pVVar8->nSize);
  }
  if (0 < vCofs->nSize) {
    lVar9 = 0;
    do {
      pDVar5 = (DdNode *)vCofs->pArray[lVar9];
      pDVar6 = Cudd_ReadLogicZero(dd);
      if (pDVar5 != pDVar6) {
        pAVar4 = Aig_NodeBddToMuxes_rec
                           (dd,(DdNode *)((ulong)pDVar5 & 0xfffffffffffffffe),p_00,table);
        Aig_ObjCreateCo(p_00,(Aig_Obj_t *)((ulong)((uint)pDVar5 & 1) ^ (ulong)pAVar4));
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vCofs->nSize);
  }
  st__free_table(table);
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    lVar9 = 0;
    do {
      if (lVar9 != 0) {
        pvVar1 = pVVar8->pArray[lVar9];
        Aig_ManDupSimpleDfs_rec
                  (p_00,p,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe));
        if (((ulong)pvVar1 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
        pVVar8 = p->vCos;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar8->nSize);
  }
  Aig_ManCleanup(p_00);
  Aig_ManSetRegNum(p_00,p->nRegs);
  iVar2 = Aig_ManCheck(p_00);
  if (iVar2 == 0) {
    puts("Aig_ManConvertBddsToAigs(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManConvertBddsToAigs( Aig_Man_t * p, DdManager * dd, Vec_Ptr_t * vCofs )
{
    DdNode * bFunc;
    st__table * tBdd2Node;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanData( p );
    // generate AIG for BDD
    pNew = Aig_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create the table mapping BDD nodes into the ABC nodes
    tBdd2Node = st__init_table( st__ptrcmp, st__ptrhash );
    // add the constant and the elementary vars
    st__insert( tBdd2Node, (char *)Cudd_ReadOne(dd), (char *)Aig_ManConst1(pNew) );
    Aig_ManForEachCi( p, pObj, i )
        st__insert( tBdd2Node, (char *)Cudd_bddIthVar(dd, i), (char *)pObj->pData );
    // build primary outputs for the cofactors
    Vec_PtrForEachEntry( DdNode *, vCofs, bFunc, i )
    {
        if ( bFunc == Cudd_ReadLogicZero(dd) )
            continue;
        pObj = Aig_NodeBddToMuxes_rec( dd, Cudd_Regular(bFunc), pNew, tBdd2Node );
        pObj = Aig_NotCond( pObj, Cudd_IsComplement(bFunc) );
        Aig_ObjCreateCo( pNew, pObj );
    }
    st__free_table( tBdd2Node );

    // duplicate the rest of the AIG
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
    {
        if ( i == 0 )
            continue;
        Aig_ManDupSimpleDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManConvertBddsToAigs(): The check has failed.\n" );
    return pNew;
}